

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::IsFltBuiltInConst(PropertyId propertyId)

{
  bool bVar1;
  
  bVar1 = true;
  if ((((0x2b < (uint)propertyId) || ((0xb0000000000U >> ((ulong)(uint)propertyId & 0x3f) & 1) == 0)
       ) && (1 < propertyId - 0xd3U)) && ((1 < propertyId - 0x157U && (propertyId != 0x75)))) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool JavascriptLibrary::IsFltBuiltInConst(PropertyId propertyId)
    {
        switch (propertyId)
        {
        case Js::PropertyIds::E:
        case Js::PropertyIds::LN10:
        case Js::PropertyIds::LN2:
        case Js::PropertyIds::LOG2E:
        case Js::PropertyIds::LOG10E:
        case Js::PropertyIds::PI:
        case Js::PropertyIds::SQRT1_2:
        case Js::PropertyIds::SQRT2:
            return true;
        }
        return false;
    }